

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::value_and_holder::value_and_holder
          (value_and_holder *this,instance *i,type_info *type,size_t vpos,size_t index)

{
  anon_union_24_2_63b86169_for_instance_1 *local_48;
  size_t index_local;
  size_t vpos_local;
  type_info *type_local;
  instance *i_local;
  value_and_holder *this_local;
  
  this->inst = i;
  this->index = index;
  this->type = type;
  if (((byte)this->inst->field_0x30 >> 1 & 1) == 0) {
    local_48 = (anon_union_24_2_63b86169_for_instance_1 *)
               ((this->inst->field_1).nonsimple.values_and_holders + vpos);
  }
  else {
    local_48 = &this->inst->field_1;
  }
  this->vh = (void **)local_48;
  return;
}

Assistant:

value_and_holder(instance *i, const detail::type_info *type, size_t vpos, size_t index)
        : inst{i}, index{index}, type{type}, vh{inst->simple_layout
                                                    ? inst->simple_value_holder
                                                    : &inst->nonsimple.values_and_holders[vpos]} {}